

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O0

ValidateXrHandleResult __thiscall
HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo>::verifyHandle
          (HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo> *this,
          XrTriangleMeshFB_T **handle_to_check)

{
  bool bVar1;
  _Node_iterator_base<std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
  local_50;
  _Node_iterator_base<std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
  local_48;
  iterator entry_returned;
  undefined1 local_30 [8];
  UniqueLock lock;
  XrTriangleMeshFB_T **handle_to_check_local;
  HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo> *this_local;
  
  if (handle_to_check == (XrTriangleMeshFB_T **)0x0) {
    this_local._4_4_ = VALIDATE_XR_HANDLE_INVALID;
  }
  else if (*handle_to_check == (XrTriangleMeshFB_T *)0x0) {
    this_local._4_4_ = VALIDATE_XR_HANDLE_NULL;
  }
  else {
    lock._8_8_ = handle_to_check;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_30,&this->dispatch_mutex_);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<XrTriangleMeshFB_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrTriangleMeshFB_T_*>,_std::equal_to<XrTriangleMeshFB_T_*>,_std::allocator<std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
         ::find(&this->info_map_,(key_type *)lock._8_8_);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<XrTriangleMeshFB_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrTriangleMeshFB_T_*>,_std::equal_to<XrTriangleMeshFB_T_*>,_std::allocator<std::pair<XrTriangleMeshFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
         ::end(&this->info_map_);
    bVar1 = std::__detail::operator==(&local_50,&local_48);
    if (bVar1) {
      this_local._4_4_ = VALIDATE_XR_HANDLE_INVALID;
    }
    else {
      this_local._4_4_ = VALIDATE_XR_HANDLE_SUCCESS;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  }
  return this_local._4_4_;
}

Assistant:

inline ValidateXrHandleResult HandleInfoBase<HandleType, InfoType>::verifyHandle(HandleType const *handle_to_check) {
    try {
        if (nullptr == handle_to_check) {
            return VALIDATE_XR_HANDLE_INVALID;
        }
        // XR_NULL_HANDLE is valid in some cases, so we want to return that we found that value
        // and let the calling function decide what to do with it.
        if (*handle_to_check == XR_NULL_HANDLE) {
            return VALIDATE_XR_HANDLE_NULL;
        }

        // Try to find the handle in the appropriate map
        UniqueLock lock(dispatch_mutex_);
        auto entry_returned = info_map_.find(*handle_to_check);
        // If it is not a valid handle, it should return the end of the map.
        if (info_map_.end() == entry_returned) {
            return VALIDATE_XR_HANDLE_INVALID;
        }
        return VALIDATE_XR_HANDLE_SUCCESS;
    } catch (...) {
        return VALIDATE_XR_HANDLE_INVALID;
    }
}